

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O2

void __thiscall
Corrade::Utility::Arguments::Entry::Entry
          (Entry *this,Type type,char shortKey,string *key,string *helpKey,string *defaultValue,
          size_t id)

{
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this->type = type;
  this->shortKey = shortKey;
  std::__cxx11::string::string((string *)&this->key,(string *)key);
  (this->help)._M_dataplus._M_p = (pointer)&(this->help).field_2;
  (this->help)._M_string_length = 0;
  (this->help).field_2._M_local_buf[0] = '\0';
  (this->helpKey)._M_dataplus._M_p = (pointer)&(this->helpKey).field_2;
  (this->helpKey)._M_string_length = 0;
  (this->helpKey).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->defaultValue,(string *)defaultValue);
  (this->environment)._M_dataplus._M_p = (pointer)&(this->environment).field_2;
  (this->environment)._M_string_length = 0;
  (this->environment).field_2._M_local_buf[0] = '\0';
  this->id = id;
  if ((byte)(type - NamedArgument) < 3) {
    std::operator+(&local_90,&this->key,' ');
    std::__cxx11::string::string((string *)&local_b0,(string *)helpKey);
    anon_unknown_3::uppercaseKey(&local_70,&local_b0);
    std::operator+(&local_50,&local_90,&local_70);
    std::__cxx11::string::operator=((string *)&this->helpKey,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    return;
  }
  std::__cxx11::string::operator=((string *)&this->helpKey,(string *)helpKey);
  return;
}

Assistant:

Arguments::Entry::Entry(Type type, char shortKey, std::string key, std::string helpKey, std::string defaultValue, std::size_t id): type(type), shortKey(shortKey), key(std::move(key)), defaultValue(std::move(defaultValue)), id(id) {
    if(type == Type::NamedArgument || type == Type::Option || type == Type::ArrayOption)
        this->helpKey = this->key + ' ' + uppercaseKey(helpKey);
    else this->helpKey = std::move(helpKey);
}